

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamIGA.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamIGA::ComputeInternalForces(ChElementBeamIGA *this,ChVectorDynamic<> *Fi)

{
  int iVar1;
  ChStateDelta mstate_w;
  ChState mstate_x;
  ChStateDelta local_40;
  ChState local_28;
  
  iVar1 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[0x1e])();
  ChState::ChState(&local_28,(long)iVar1,(ChIntegrable *)0x0);
  iVar1 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[0x1f])(this);
  ChStateDelta::ChStateDelta(&local_40,(long)iVar1,(ChIntegrable *)0x0);
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[0x20]
  )(this,0,&local_28);
  (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[0x21]
  )(this,0,&local_40);
  ComputeInternalForces_impl(this,Fi,&local_28,&local_40,false);
  Eigen::internal::handmade_aligned_free
            (local_40.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (local_28.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

void ChElementBeamIGA::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    ChState mstate_x(this->LoadableGet_ndof_x(), nullptr);
    ChStateDelta mstate_w(this->LoadableGet_ndof_w(), nullptr);
    this->LoadableGetStateBlock_x(0, mstate_x);
    this->LoadableGetStateBlock_w(0, mstate_w);
    ComputeInternalForces_impl(Fi, mstate_x, mstate_w);
}